

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O0

TSTNode<unsigned_short> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,unsigned_short *oracle,
          size_t param_3)

{
  unsigned_short uVar1;
  TSTNode<unsigned_short> *this_00;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_01;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_02;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_03;
  size_type sVar2;
  const_reference ppuVar3;
  reference ppvVar4;
  uint local_60;
  uint i;
  unsigned_short pivot;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket2;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket1;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket0;
  TSTNode<unsigned_short> *new_node;
  size_t param_3_local;
  unsigned_short *oracle_local;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket_local;
  BurstSimple<unsigned_short> *this_local;
  
  this_00 = (TSTNode<unsigned_short> *)operator_new(0x28);
  TSTNode<unsigned_short>::TSTNode(this_00);
  this_01 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector(this_01);
  this_02 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector(this_02);
  this_03 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector(this_03);
  sVar2 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(bucket);
  uVar1 = pseudo_median<unsigned_short>(oracle,oracle + sVar2);
  for (local_60 = 0;
      sVar2 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(bucket),
      local_60 < sVar2; local_60 = local_60 + 1) {
    if (oracle[local_60] < uVar1) {
      ppuVar3 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                          (bucket,(ulong)local_60);
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back(this_01,ppuVar3);
    }
    else if (oracle[local_60] == uVar1) {
      ppuVar3 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                          (bucket,(ulong)local_60);
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back(this_02,ppuVar3);
    }
    else {
      ppuVar3 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                          (bucket,(ulong)local_60);
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back(this_03,ppuVar3);
    }
  }
  this_00->pivot = uVar1;
  ppvVar4 = std::array<void_*,_3UL>::operator[]((array<void_*,_3UL> *)this_00,0);
  *ppvVar4 = this_01;
  ppvVar4 = std::array<void_*,_3UL>::operator[]((array<void_*,_3UL> *)this_00,1);
  *ppvVar4 = this_02;
  ppvVar4 = std::array<void_*,_3UL>::operator[]((array<void_*,_3UL> *)this_00,2);
  *ppvVar4 = this_03;
  return this_00;
}

Assistant:

TSTNode<CharT>*
	operator()(const BucketT& bucket, CharT* oracle, size_t /*depth*/) const
	{
		TSTNode<CharT>* new_node = new TSTNode<CharT>;
		BucketT* bucket0 = new BucketT;
		BucketT* bucket1 = new BucketT;
		BucketT* bucket2 = new BucketT;
		CharT pivot = pseudo_median(oracle, oracle+bucket.size());
		for (unsigned i=0; i < bucket.size(); ++i) {
			if (oracle[i] < pivot) {
				bucket0->push_back(bucket[i]);
			} else if (oracle[i] == pivot) {
				bucket1->push_back(bucket[i]);
			} else {
				bucket2->push_back(bucket[i]);
			}
		}
		new_node->pivot = pivot;
		new_node->buckets[0] = bucket0;
		new_node->buckets[1] = bucket1;
		new_node->buckets[2] = bucket2;
		debug() << "BurstSimple() pivot=" << pivot
			<< " [0]=" << bucket0->size()
			<< " [1]=" << bucket1->size()
			<< " [2]=" << bucket2->size()
			<< "\n";
		return new_node;
	}